

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intermediate.cpp
# Opt level: O0

TIntermTyped * __thiscall
glslang::TIntermediate::createConversion
          (TIntermediate *this,TBasicType convertTo,TIntermTyped *node)

{
  TOperator op;
  bool bVar1;
  int iVar2;
  TBasicType src;
  int mc;
  int mr;
  undefined4 extraout_var;
  TIntermediate *node_00;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  TQualifier *pTVar3;
  long *plVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  TIntermTyped *folded;
  TType newType;
  TOperator newOp;
  TIntermUnary *newNode;
  bool convertFromFloatTypes;
  bool convertToFloatTypes;
  bool convertFromIntTypes;
  bool convertToIntTypes;
  TIntermTyped *node_local;
  TBasicType convertTo_local;
  TIntermediate *this_local;
  
  bVar5 = true;
  if ((((((convertTo != EbtInt8) && (bVar5 = true, convertTo != EbtUint8)) &&
        (bVar5 = true, convertTo != EbtInt16)) &&
       ((bVar5 = true, convertTo != EbtUint16 && (bVar5 = true, convertTo != EbtInt)))) &&
      (bVar5 = true, convertTo != EbtUint)) && (bVar5 = true, convertTo != EbtInt64)) {
    bVar5 = convertTo == EbtUint64;
  }
  iVar2 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x20])();
  bVar6 = true;
  if (iVar2 != 4) {
    iVar2 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x20])();
    bVar6 = true;
    if (iVar2 != 5) {
      iVar2 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x20])();
      bVar6 = true;
      if (iVar2 != 6) {
        iVar2 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x20])();
        bVar6 = true;
        if (iVar2 != 7) {
          iVar2 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x20])();
          bVar6 = true;
          if (iVar2 != 8) {
            iVar2 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x20])();
            bVar6 = true;
            if (iVar2 != 9) {
              iVar2 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x20])();
              bVar6 = true;
              if (iVar2 != 10) {
                iVar2 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x20])();
                bVar6 = iVar2 == 0xb;
              }
            }
          }
        }
      }
    }
  }
  bVar7 = true;
  if ((convertTo != EbtFloat16) && (bVar7 = true, convertTo != EbtFloat)) {
    bVar7 = convertTo == EbtDouble;
  }
  iVar2 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x20])();
  bVar8 = true;
  if (iVar2 != 3) {
    iVar2 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x20])();
    bVar8 = true;
    if (iVar2 != 1) {
      iVar2 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x20])();
      bVar8 = iVar2 == 2;
    }
  }
  if (((((convertTo == EbtInt8) || (convertTo == EbtUint8)) && (!bVar6)) ||
      (((iVar2 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x20])(), iVar2 == 4 ||
        (iVar2 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x20])(), iVar2 == 5)) && (!bVar5))))
     && (bVar1 = getArithemeticInt8Enabled(this), !bVar1)) {
    return (TIntermTyped *)0x0;
  }
  if (((((convertTo == EbtInt16) || (convertTo == EbtUint16)) && (!bVar6)) ||
      (((iVar2 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x20])(), iVar2 == 6 ||
        (iVar2 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x20])(), iVar2 == 7)) && (!bVar5))))
     && (bVar5 = getArithemeticInt16Enabled(this), !bVar5)) {
    return (TIntermTyped *)0x0;
  }
  if ((((convertTo == EbtFloat16) && (!bVar8)) ||
      ((iVar2 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x20])(), iVar2 == 3 && (!bVar7)))) &&
     (bVar5 = getArithemeticFloat16Enabled(this), !bVar5)) {
    return (TIntermTyped *)0x0;
  }
  newType.spirvType._4_4_ = EOpNull;
  src = (*(node->super_TIntermNode)._vptr_TIntermNode[0x20])();
  bVar5 = buildConvertOp(this,convertTo,src,(TOperator *)((long)&newType.spirvType + 4));
  if (!bVar5) {
    return (TIntermTyped *)0x0;
  }
  iVar2 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x26])();
  mc = (*(node->super_TIntermNode)._vptr_TIntermNode[0x27])();
  mr = (*(node->super_TIntermNode)._vptr_TIntermNode[0x28])();
  TType::TType((TType *)&folded,convertTo,EvqTemporary,iVar2,mc,mr,false);
  op = newType.spirvType._4_4_;
  iVar2 = (**(node->super_TIntermNode)._vptr_TIntermNode)();
  node_00 = (TIntermediate *)
            addUnaryNode(this,op,node,(TSourceLoc *)CONCAT44(extraout_var,iVar2),(TType *)&folded);
  iVar2 = (*(node->super_TIntermNode)._vptr_TIntermNode[5])();
  if ((((CONCAT44(extraout_var_00,iVar2) != 0) &&
       ((bVar5 = getArithemeticInt8Enabled(this), bVar5 ||
        ((convertTo != EbtInt8 && (convertTo != EbtUint8)))))) &&
      ((bVar5 = getArithemeticInt16Enabled(this), bVar5 ||
       ((convertTo != EbtInt16 && (convertTo != EbtUint16)))))) &&
     ((bVar5 = getArithemeticFloat16Enabled(this), bVar5 || (convertTo != EbtFloat16)))) {
    iVar2 = (*(node->super_TIntermNode)._vptr_TIntermNode[5])();
    this_local = (TIntermediate *)
                 (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar2) + 0x188))
                           ((long *)CONCAT44(extraout_var_01,iVar2),newType.spirvType._4_4_,&folded)
    ;
    if (this_local != (TIntermediate *)0x0) goto LAB_0066868d;
  }
  iVar2 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])();
  pTVar3 = (TQualifier *)(**(code **)(*(long *)CONCAT44(extraout_var_02,iVar2) + 0x58))();
  bVar5 = TQualifier::isSpecConstant(pTVar3);
  this_local = node_00;
  if ((bVar5) && (bVar5 = isSpecializationOperation(this,(TIntermOperator *)node_00), bVar5)) {
    plVar4 = (long *)(**(code **)(*(long *)node_00 + 0xf8))();
    pTVar3 = (TQualifier *)(**(code **)(*plVar4 + 0x50))();
    TQualifier::makeSpecConstant(pTVar3);
  }
LAB_0066868d:
  TType::~TType((TType *)&folded);
  return (TIntermTyped *)this_local;
}

Assistant:

TIntermTyped* TIntermediate::createConversion(TBasicType convertTo, TIntermTyped* node) const
{
    //
    // Add a new newNode for the conversion.
    //

    bool convertToIntTypes = (convertTo == EbtInt8  || convertTo == EbtUint8  ||
                              convertTo == EbtInt16 || convertTo == EbtUint16 ||
                              convertTo == EbtInt   || convertTo == EbtUint   ||
                              convertTo == EbtInt64 || convertTo == EbtUint64);

    bool convertFromIntTypes = (node->getBasicType() == EbtInt8  || node->getBasicType() == EbtUint8  ||
                                node->getBasicType() == EbtInt16 || node->getBasicType() == EbtUint16 ||
                                node->getBasicType() == EbtInt   || node->getBasicType() == EbtUint   ||
                                node->getBasicType() == EbtInt64 || node->getBasicType() == EbtUint64);

    bool convertToFloatTypes = (convertTo == EbtFloat16 || convertTo == EbtFloat || convertTo == EbtDouble);

    bool convertFromFloatTypes = (node->getBasicType() == EbtFloat16 ||
                                  node->getBasicType() == EbtFloat ||
                                  node->getBasicType() == EbtDouble);

    if (((convertTo == EbtInt8 || convertTo == EbtUint8) && ! convertFromIntTypes) ||
        ((node->getBasicType() == EbtInt8 || node->getBasicType() == EbtUint8) && ! convertToIntTypes)) {
        if (! getArithemeticInt8Enabled()) {
            return nullptr;
        }
    }

    if (((convertTo == EbtInt16 || convertTo == EbtUint16) && ! convertFromIntTypes) ||
        ((node->getBasicType() == EbtInt16 || node->getBasicType() == EbtUint16) && ! convertToIntTypes)) {
        if (! getArithemeticInt16Enabled()) {
            return nullptr;
        }
    }

    if ((convertTo == EbtFloat16 && ! convertFromFloatTypes) ||
        (node->getBasicType() == EbtFloat16 && ! convertToFloatTypes)) {
        if (! getArithemeticFloat16Enabled()) {
            return nullptr;
        }
    }

    TIntermUnary* newNode = nullptr;
    TOperator newOp = EOpNull;
    if (!buildConvertOp(convertTo, node->getBasicType(), newOp)) {
        return nullptr;
    }

    TType newType(convertTo, EvqTemporary, node->getVectorSize(), node->getMatrixCols(), node->getMatrixRows());
    newNode = addUnaryNode(newOp, node, node->getLoc(), newType);

    if (node->getAsConstantUnion()) {
        // 8/16-bit storage extensions don't support 8/16-bit constants, so don't fold conversions
        // to those types
        if ((getArithemeticInt8Enabled() || !(convertTo == EbtInt8 || convertTo == EbtUint8)) &&
            (getArithemeticInt16Enabled() || !(convertTo == EbtInt16 || convertTo == EbtUint16)) &&
            (getArithemeticFloat16Enabled() || !(convertTo == EbtFloat16)))
        {
            TIntermTyped* folded = node->getAsConstantUnion()->fold(newOp, newType);
            if (folded)
                return folded;
        }
    }

    // Propagate specialization-constant-ness, if allowed
    if (node->getType().getQualifier().isSpecConstant() && isSpecializationOperation(*newNode))
        newNode->getWritableType().getQualifier().makeSpecConstant();

    return newNode;
}